

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

char * gotcha_strstr(char *searchIn,char *searchFor)

{
  int j;
  int i;
  char *searchFor_local;
  char *searchIn_local;
  
  if (*searchFor != '\0') {
    for (i = 0; searchIn[i] != '\0'; i = i + 1) {
      if (searchIn[i] == *searchFor) {
        j = 1;
        while( true ) {
          if (searchFor[j] == '\0') {
            return searchFor + i;
          }
          if (searchIn[i + j] == '\0') {
            return (char *)0x0;
          }
          if (searchFor[j] != searchIn[i + j]) break;
          j = j + 1;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *gotcha_strstr(const char *searchIn, const char *searchFor)
{
   int i, j;
   if (!searchFor[0])
      return NULL;

   for (i = 0; searchIn[i]; i++) {
      if (searchIn[i] != searchFor[0])
         continue;
      for (j = 1; ; j++) {
         if (!searchFor[j])
            return (char*)(searchFor + i);
         if (!searchIn[i+j])
            return NULL;
         if (searchFor[j] != searchIn[i+j])
            break;
      }
   }
   return NULL;
}